

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O3

If_Grp_t *
If_CluCheck(If_Grp_t *__return_storage_ptr__,If_Man_t *p,word *pTruth0,int nVars,int iVarStart,
           int iVarStop,int nLutLeaf,int nLutRoot,If_Grp_t *pR,word *pFunc0,word *pFunc1,
           word *pLeftOver,int fHashing)

{
  byte bVar1;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  ushort uVar10;
  ushort uVar11;
  ushort uVar12;
  undefined1 auVar13 [14];
  undefined1 auVar14 [14];
  undefined1 auVar15 [14];
  undefined1 auVar16 [14];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  unkuint9 Var19;
  undefined1 auVar20 [11];
  undefined1 auVar21 [14];
  undefined1 auVar22 [11];
  undefined1 auVar23 [14];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  uint6 uVar28;
  int iVar29;
  uint uVar30;
  ulong uVar31;
  uint *puVar32;
  long lVar33;
  word wVar34;
  byte bVar35;
  byte bVar36;
  uint uVar37;
  int *V2P_00;
  int iVar38;
  word *pwVar39;
  ulong uVar40;
  word *pwVar41;
  ulong uVar42;
  uint uVar43;
  uint uVar44;
  int iVar45;
  int iVar46;
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  char acStackY_4228 [64];
  If_Grp_t R;
  int V2P [18];
  int P2V [18];
  int P2V2 [18];
  int V2P2 [18];
  word pF [1024];
  word pTruth [1024];
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  
  __return_storage_ptr__->pVars[0xe] = '\0';
  __return_storage_ptr__->pVars[0xf] = '\0';
  __return_storage_ptr__->nVars = '\0';
  __return_storage_ptr__->nMyu = '\0';
  __return_storage_ptr__->pVars[0] = '\0';
  __return_storage_ptr__->pVars[1] = '\0';
  __return_storage_ptr__->pVars[2] = '\0';
  __return_storage_ptr__->pVars[3] = '\0';
  __return_storage_ptr__->pVars[4] = '\0';
  __return_storage_ptr__->pVars[5] = '\0';
  __return_storage_ptr__->pVars[6] = '\0';
  __return_storage_ptr__->pVars[7] = '\0';
  __return_storage_ptr__->pVars[8] = '\0';
  __return_storage_ptr__->pVars[9] = '\0';
  __return_storage_ptr__->pVars[10] = '\0';
  __return_storage_ptr__->pVars[0xb] = '\0';
  __return_storage_ptr__->pVars[0xc] = '\0';
  __return_storage_ptr__->pVars[0xd] = '\0';
  R.pVars[0xe] = '\0';
  R.pVars[0xf] = '\0';
  R.nVars = '\0';
  R.nMyu = '\0';
  R.pVars[0] = '\0';
  R.pVars[1] = '\0';
  R.pVars[2] = '\0';
  R.pVars[3] = '\0';
  R.pVars[4] = '\0';
  R.pVars[5] = '\0';
  R.pVars[6] = '\0';
  R.pVars[7] = '\0';
  R.pVars[8] = '\0';
  R.pVars[9] = '\0';
  R.pVars[10] = '\0';
  R.pVars[0xb] = '\0';
  R.pVars[0xc] = '\0';
  R.pVars[0xd] = '\0';
  uVar44 = nVars;
  if (p != (If_Man_t *)0x0) {
    uVar44 = p->pPars->nLutSize;
  }
  if (0x10 < nVars) {
    __assert_fail("nVars <= CLU_VAR_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec16.c"
                  ,0x61b,
                  "If_Grp_t If_CluCheck(If_Man_t *, word *, int, int, int, int, int, If_Grp_t *, word *, word *, word *, int)"
                 );
  }
  iVar29 = nLutLeaf + nLutRoot;
  if (iVar29 <= nVars) {
    __assert_fail("nVars <= nLutLeaf + nLutRoot - 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec16.c"
                  ,0x61c,
                  "If_Grp_t If_CluCheck(If_Man_t *, word *, int, int, int, int, int, If_Grp_t *, word *, word *, word *, int)"
                 );
  }
  if (pR != (If_Grp_t *)0x0) {
    pR->nVars = '\0';
    *pFunc0 = 0;
    *pFunc1 = 0;
  }
  uVar30 = 1 << ((char)uVar44 - 6U & 0x1f);
  if ((int)uVar44 < 7) {
    uVar30 = 1;
  }
  if (0 < (int)uVar30) {
    memcpy(pTruth,pTruth0,(ulong)uVar30 << 3);
  }
  uVar43 = 1 << ((char)nVars - 6U & 0x1f);
  uVar30 = 1;
  if (6 < nVars) {
    uVar30 = uVar43;
  }
  memcpy(pF,pTruth,(ulong)uVar30 << 3);
  if (nVars < 1) {
    return __return_storage_ptr__;
  }
  uVar31 = 0;
  do {
    P2V[uVar31] = (int)uVar31;
    V2P[uVar31] = (int)uVar31;
    uVar31 = uVar31 + 1;
  } while ((uint)nVars != uVar31);
  if (nVars < 1) {
    return __return_storage_ptr__;
  }
  if ((uint)nVars < 7) {
    uVar43 = 1;
  }
  uVar31 = 0;
  uVar30 = 0;
LAB_00419797:
  if (uVar31 < 6) {
    uVar37 = 1 << ((byte)uVar31 & 0x1f);
    uVar40 = 0;
    do {
      if ((pF[uVar40] & ~Truth6[uVar31]) != (pF[uVar40] & Truth6[uVar31]) >> ((byte)uVar37 & 0x3f))
      goto LAB_00419845;
      uVar40 = uVar40 + 1;
    } while (uVar43 != uVar40);
  }
  else {
    bVar36 = (byte)(uVar31 - 6);
    uVar37 = 1 << (bVar36 & 0x1f);
    iVar38 = 2 << (bVar36 & 0x1f);
    uVar40 = 1;
    if (1 < (int)uVar37) {
      uVar40 = (ulong)uVar37;
    }
    pwVar39 = pF + (int)uVar37;
    iVar45 = 0;
    pwVar41 = pF;
    do {
      if (uVar31 - 6 != 0x1f) {
        uVar42 = 0;
        do {
          if (pwVar41[uVar42] != pwVar39[uVar42]) {
            uVar37 = 1 << ((byte)uVar31 & 0x1f);
            goto LAB_00419845;
          }
          uVar42 = uVar42 + 1;
        } while (uVar40 != uVar42);
      }
      iVar45 = iVar45 + iVar38;
      pwVar39 = pwVar39 + iVar38;
      pwVar41 = pwVar41 + iVar38;
    } while (iVar45 < (int)uVar43);
  }
  goto LAB_0041984b;
LAB_00419845:
  uVar30 = uVar37 | uVar30;
LAB_0041984b:
  uVar31 = uVar31 + 1;
  if (uVar31 == (uint)nVars) goto code_r0x00419857;
  goto LAB_00419797;
code_r0x00419857:
  if (uVar30 == 0) {
    return __return_storage_ptr__;
  }
  if ((uVar30 + 1 & uVar30) != 0) {
    return __return_storage_ptr__;
  }
  if (fHashing == 0 || p == (If_Man_t *)0x0) {
    puVar32 = (uint *)0x0;
  }
  else {
    puVar32 = If_CluHashLookup(p,pTruth,0);
    if (puVar32 == (uint *)0x0) {
      puVar32 = (uint *)0x0;
    }
    else {
      uVar30 = *puVar32;
      if (uVar30 != 0xff) {
        uVar37 = uVar30 >> 0xc;
        uVar43 = uVar30 >> 4;
        uVar12 = (ushort)(uVar30 >> 0x10);
        uVar11 = uVar12 >> 4 & 0xff;
        uVar7 = (ushort)uVar30 & 0xff;
        uVar8 = (ushort)uVar43 & 0xff;
        uVar9 = (ushort)(uVar30 >> 8) & 0xff;
        uVar10 = (ushort)uVar37 & 0xff;
        bVar36 = ((uVar30 & 0xff) != 0) * (uVar7 < 0x100) * (char)uVar30 - (0xff < uVar7);
        bVar35 = ((uVar43 & 0xff) != 0) * (uVar8 < 0x100) * (char)uVar43 - (0xff < uVar8);
        bVar1 = ((uVar30 & 0xff00) != 0) * (uVar9 < 0x100) * (char)(uVar30 >> 8) - (0xff < uVar9);
        bVar2 = ((uVar37 & 0xff) != 0) * (uVar10 < 0x100) * (char)uVar37 - (0xff < uVar10);
        bVar3 = ((uVar30 & 0xff0000) != 0) * ((uVar12 & 0xff) < 0x100) * (char)(uVar30 >> 0x10) -
                (0xff < (uVar12 & 0xff));
        bVar4 = (uVar11 != 0) * (uVar11 < 0x100) * (char)(uVar30 >> 0x14) - (0xff < uVar11);
        bVar6 = (byte)(uVar30 >> 0x18);
        uVar7 = (ushort)bVar6;
        bVar5 = (uVar7 != 0) * (uVar7 < 0x100) * bVar6 - (0xff < uVar7);
        uVar12 = uVar12 >> 0xc;
        bVar6 = (uVar12 != 0) * (uVar12 < 0x100) * (bVar6 >> 4) - (0xff < uVar12);
        uVar31 = CONCAT17((bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6),
                          CONCAT16((bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5),
                                   CONCAT15((bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4),
                                            CONCAT14((bVar3 != 0) * (bVar3 < 0x100) * bVar3 -
                                                     (0xff < bVar3),
                                                     CONCAT13((bVar2 != 0) * (bVar2 < 0x100) * bVar2
                                                              - (0xff < bVar2),
                                                              CONCAT12((bVar1 != 0) *
                                                                       (bVar1 < 0x100) * bVar1 -
                                                                       (0xff < bVar1),
                                                                       CONCAT11((bVar35 != 0) *
                                                                                (bVar35 < 0x100) *
                                                                                bVar35 - (0xff < 
                                                  bVar35),(bVar36 != 0) * (bVar36 < 0x100) * bVar36
                                                          - (0xff < bVar36)))))))) &
                 (ulong)DAT_009b93f0;
        __return_storage_ptr__->nVars = (char)uVar31;
        __return_storage_ptr__->nMyu = (char)(uVar31 >> 8);
        __return_storage_ptr__->pVars[0] = (char)(uVar31 >> 0x10);
        __return_storage_ptr__->pVars[1] = (char)(uVar31 >> 0x18);
        __return_storage_ptr__->pVars[2] = (char)(uVar31 >> 0x20);
        __return_storage_ptr__->pVars[3] = (char)(uVar31 >> 0x28);
        __return_storage_ptr__->pVars[4] = (char)(uVar31 >> 0x30);
        __return_storage_ptr__->pVars[5] = (char)(uVar31 >> 0x38);
      }
    }
  }
  if (iVarStop != 0) {
    If_CluMoveVar(pF,nVars,V2P,P2V,0,nVars + -1);
  }
  if ((__return_storage_ptr__->nVars == '\0') &&
     ((s_Count2 = s_Count2 + 1, iVarStart != 0 ||
      (If_CluDecUsingCofs(__return_storage_ptr__,pTruth,nVars,nLutLeaf),
      __return_storage_ptr__->nVars == '\0')))) {
    iVar38 = nVars + 1;
    If_CluFindGroup(__return_storage_ptr__,pF,nVars,iVarStart,iVarStop,V2P,P2V,nLutLeaf,
                    (uint)(iVar29 == iVar38));
    if (__return_storage_ptr__->nVars == '\0') {
      if (nVars < iVar29 + -2) {
        If_CluFindGroup(__return_storage_ptr__,pF,nVars,iVarStart,iVarStop,V2P,P2V,nLutLeaf + -1,
                        (uint)(nLutLeaf + nLutRoot + -1 == iVar38));
      }
      if (nVars < iVar29 + -3 && 4 < nLutLeaf) {
        If_CluFindGroup(__return_storage_ptr__,pF,nVars,iVarStart,iVarStop,V2P,P2V,nLutLeaf + -2,
                        (uint)(nLutLeaf + nLutRoot + -2 == iVar38));
      }
      if (__return_storage_ptr__->nVars == '\0') {
        If_CluReverseOrder(pF,nVars,V2P,P2V,iVarStart);
        If_CluFindGroup(__return_storage_ptr__,pF,nVars,iVarStart,iVarStop,V2P,P2V,nLutLeaf,
                        (uint)(iVar29 == iVar38));
        if (__return_storage_ptr__->nVars == '\0') {
          if (puVar32 == (uint *)0x0) {
            return __return_storage_ptr__;
          }
          iVar29 = 0;
          iVar38 = 1;
          iVar45 = 2;
          iVar46 = 3;
          lVar33 = 0;
          uVar44 = 0;
          uVar30 = 0;
          uVar43 = 0;
          uVar37 = 0;
          do {
            auVar47 = ZEXT415(*(uint *)(__return_storage_ptr__->pVars + lVar33 + -2)) &
                      DAT_009b9400._0_15_;
            Var19 = CONCAT81(SUB158(ZEXT115(0) << 0x40,7),auVar47[3]);
            auVar24._9_6_ = 0;
            auVar24._0_9_ = Var19;
            auVar20._1_10_ = SUB1510(auVar24 << 0x30,5);
            auVar20[0] = auVar47[2];
            auVar25._11_4_ = 0;
            auVar25._0_11_ = auVar20;
            auVar48[2] = auVar47[1];
            auVar48._0_2_ = auVar47._0_2_;
            auVar48._3_12_ = SUB1512(auVar25 << 0x20,3);
            auVar17._2_13_ = auVar48._2_13_;
            auVar17._0_2_ = auVar47._0_2_ & 0xff;
            auVar13._10_2_ = 0;
            auVar13._0_10_ = auVar17._0_10_;
            auVar13._12_2_ = (short)Var19;
            uVar28 = CONCAT42(auVar13._10_4_,auVar20._0_2_);
            auVar21._6_8_ = 0;
            auVar21._0_6_ = uVar28;
            auVar15._4_2_ = auVar48._2_2_;
            auVar15._0_4_ = auVar17._0_4_;
            auVar15._6_8_ = SUB148(auVar21 << 0x40,6);
            auVar49._4_4_ = (int)(float)(iVar38 * 0x2000000 + 0x3f800000);
            auVar49._12_4_ = (int)(float)(iVar46 * 0x2000000 + 0x3f800000);
            auVar49._0_4_ = auVar49._4_4_;
            auVar49._8_4_ = auVar49._12_4_;
            uVar44 = uVar44 | (auVar17._0_4_ & 0xffff) *
                              (int)(float)(iVar29 * 0x2000000 + 0x3f800000);
            uVar30 = uVar30 | auVar49._4_4_ * auVar15._4_4_;
            uVar43 = uVar43 | (uint)(((ulong)uVar28 & 0xffffffff) *
                                    (ulong)(uint)(int)(float)(iVar45 * 0x2000000 + 0x3f800000));
            uVar37 = uVar37 | (uint)((auVar49._8_8_ & 0xffffffff) * (ulong)(auVar13._10_4_ >> 0x10))
            ;
            lVar33 = lVar33 + 4;
            iVar29 = iVar29 + 4;
            iVar38 = iVar38 + 4;
            iVar45 = iVar45 + 4;
            iVar46 = iVar46 + 4;
          } while (lVar33 != 8);
          goto LAB_0041a0b0;
        }
      }
    }
  }
  if (pR != (If_Grp_t *)0x0) {
    If_CluMoveGroupToMsb(pF,nVars,V2P,P2V,__return_storage_ptr__);
    if (__return_storage_ptr__->nMyu == '\x02') {
      wVar34 = If_CluDeriveDisjoint(pF,nVars,V2P_00,P2V,__return_storage_ptr__,&R);
      iVar29 = -1;
    }
    else {
      wVar34 = If_CluDeriveNonDisjoint(pF,nVars,V2P_00,P2V,__return_storage_ptr__,&R);
      iVar29 = -2;
    }
    uVar30 = (uint)R.nVars;
    iVar29 = iVar29 + uVar30;
    lVar33 = (long)iVar29;
    if (R.pVars[lVar33] != nVars) {
      __assert_fail("R.pVars[iNewPos] == nVars",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec16.c"
                    ,0x6a5,
                    "If_Grp_t If_CluCheck(If_Man_t *, word *, int, int, int, int, int, If_Grp_t *, word *, word *, word *, int)"
                   );
    }
    bVar36 = __return_storage_ptr__->nVars;
    uVar43 = (uint)(char)bVar36;
    if (6 < uVar43) {
LAB_0041a11c:
      __assert_fail("nVars >= 0 && nVars <= 6",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec16.c"
                    ,0x174,"word If_CluAdjust(word, int)");
    }
    if (bVar36 != 6) {
      bVar35 = (byte)(1 << (bVar36 & 0x1f));
      uVar42 = wVar34 & ~(-1L << (bVar35 & 0x3f));
      uVar40 = 0;
      uVar31 = uVar42 << (bVar35 & 0x3f);
      if (bVar36 != 0) {
        uVar31 = uVar40;
      }
      uVar31 = uVar31 | uVar42;
      uVar42 = uVar31 * 4;
      if (1 < bVar36) {
        uVar42 = uVar40;
      }
      uVar42 = uVar42 | uVar31;
      uVar37 = 2;
      if (2 < uVar43) {
        uVar37 = uVar43;
      }
      uVar31 = uVar42 << 4;
      if (2 < bVar36) {
        uVar31 = uVar40;
      }
      uVar43 = 3;
      if (2 < bVar36) {
        uVar43 = uVar37;
      }
      uVar31 = uVar31 | uVar42;
      uVar42 = uVar31 << 8;
      if (uVar43 != 3) {
        uVar42 = uVar40;
      }
      uVar42 = uVar42 | uVar31;
      uVar31 = uVar42 << 0x10;
      if (1 < uVar43 - 3) {
        uVar31 = uVar40;
      }
      uVar31 = uVar31 | uVar42;
      wVar34 = uVar31 << 0x20 | uVar31;
    }
    if (R.nVars < '\x06') {
      if (6 < (byte)R.nVars) goto LAB_0041a11c;
      bVar36 = (byte)(1L << (R.nVars & 0x3fU));
      uVar42 = ~(-1L << (bVar36 & 0x3f)) & pF[0];
      uVar40 = 0;
      uVar31 = uVar42 << (bVar36 & 0x3f);
      if ((R._0_8_ & 0xff) != 0) {
        uVar31 = uVar40;
      }
      uVar31 = uVar31 | uVar42;
      uVar42 = uVar31 * 4;
      if (1 < (byte)R.nVars) {
        uVar42 = uVar40;
      }
      uVar42 = uVar42 | uVar31;
      uVar43 = 2;
      if (2 < uVar30) {
        uVar43 = uVar30;
      }
      uVar31 = uVar42 << 4;
      if (2U < (byte)R.nVars) {
        uVar31 = uVar40;
      }
      uVar37 = 3;
      if (2U < (byte)R.nVars) {
        uVar37 = uVar43;
      }
      uVar31 = uVar31 | uVar42;
      uVar42 = uVar31 << 8;
      if (uVar37 != 3) {
        uVar42 = uVar40;
      }
      uVar42 = uVar42 | uVar31;
      uVar31 = uVar42 << 0x10;
      if (1 < uVar37 - 3) {
        uVar31 = uVar40;
      }
      uVar31 = uVar31 | uVar42;
      pF[0] = uVar31 << 0x20 | uVar31;
    }
    if (iVar29 < iVarStart) {
      __assert_fail("iNewPos >= iVarStart",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec16.c"
                    ,0x6b3,
                    "If_Grp_t If_CluCheck(If_Man_t *, word *, int, int, int, int, int, If_Grp_t *, word *, word *, word *, int)"
                   );
    }
    if ((R._0_8_ & 0xff) != 0) {
      uVar31 = 0;
      do {
        P2V2[uVar31] = (int)uVar31;
        V2P2[uVar31] = (int)uVar31;
        uVar31 = uVar31 + 1;
      } while ((R._0_8_ & 0xff) != uVar31);
    }
    If_CluMoveVar(pF,uVar30,V2P2,P2V2,iVar29,iVarStart);
    if (iVarStart < iVar29) {
      do {
        R.pVars[lVar33] = R.pVars[lVar33 + -1];
        lVar33 = lVar33 + -1;
      } while (iVarStart < lVar33);
    }
    R.pVars[iVarStart] = (char)nVars;
    if (pLeftOver != (word *)0x0) {
      uVar30 = (uint)R.nVars;
      if ((int)uVar30 < 6) {
        if (6 < (byte)R.nVars) goto LAB_0041a11c;
        bVar36 = (byte)(1 << (R.nVars & 0x1fU));
        uVar42 = ~(-1L << (bVar36 & 0x3f)) & pF[0];
        uVar40 = 0;
        uVar31 = uVar42 << (bVar36 & 0x3f);
        if (R.nVars != '\0') {
          uVar31 = uVar40;
        }
        uVar31 = uVar31 | uVar42;
        uVar42 = uVar31 * 4;
        if (1 < (byte)R.nVars) {
          uVar42 = uVar40;
        }
        uVar42 = uVar42 | uVar31;
        uVar43 = 2;
        if (2 < uVar30) {
          uVar43 = uVar30;
        }
        uVar31 = uVar42 << 4;
        if (2U < (byte)R.nVars) {
          uVar31 = uVar40;
        }
        uVar37 = 3;
        if (2U < (byte)R.nVars) {
          uVar37 = uVar43;
        }
        uVar31 = uVar31 | uVar42;
        uVar42 = uVar31 << 8;
        if (uVar37 != 3) {
          uVar42 = uVar40;
        }
        uVar42 = uVar42 | uVar31;
        uVar31 = uVar42 << 0x10;
        if (1 < uVar37 - 3) {
          uVar31 = uVar40;
        }
        uVar31 = uVar31 | uVar42;
        *pLeftOver = uVar31 << 0x20 | uVar31;
      }
      else if (uVar30 - 6 != 0x1f) {
        memcpy(pLeftOver,pF,(ulong)(uint)(1 << ((byte)(uVar30 - 6) & 0x1f)) << 3);
      }
      if (uVar44 != uVar30) {
        if ((int)uVar44 <= (int)uVar30) {
          __assert_fail("nVarsCur < nVarsMax",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec16.c"
                        ,0x18b,"void If_CluAdjustBig(word *, int, int)");
        }
        if (6 < (int)uVar44) {
          uVar43 = 6;
          if (6 < (int)uVar30) {
            uVar43 = uVar30;
          }
          do {
            uVar30 = 1 << ((char)uVar43 - 6U & 0x1f);
            if (uVar43 < 7) {
              uVar30 = 1;
            }
            if (0 < (int)uVar30) {
              uVar31 = 0;
              do {
                pLeftOver[(long)(int)uVar30 + uVar31] = pLeftOver[uVar31];
                uVar31 = uVar31 + 1;
              } while (uVar30 != uVar31);
            }
            uVar43 = uVar43 + 1;
          } while ((int)uVar43 < (int)uVar44);
        }
      }
    }
    *(undefined2 *)(pR->pVars + 0xe) = R.pVars._14_2_;
    pR->nVars = R.nVars;
    pR->nMyu = R.nMyu;
    pR->pVars[0] = R.pVars[0];
    pR->pVars[1] = R.pVars[1];
    pR->pVars[2] = R.pVars[2];
    pR->pVars[3] = R.pVars[3];
    pR->pVars[4] = R.pVars[4];
    pR->pVars[5] = R.pVars[5];
    *(undefined8 *)(pR->pVars + 6) = R.pVars._6_8_;
    if (pFunc0 != (word *)0x0) {
      *pFunc0 = pF[0];
    }
    if (pFunc1 != (word *)0x0) {
      *pFunc1 = wVar34;
    }
  }
  if (puVar32 == (uint *)0x0) {
    return __return_storage_ptr__;
  }
  iVar29 = 0;
  iVar38 = 1;
  iVar45 = 2;
  iVar46 = 3;
  lVar33 = 0;
  uVar44 = 0;
  uVar30 = 0;
  uVar43 = 0;
  uVar37 = 0;
  do {
    auVar48 = ZEXT415(*(uint *)(__return_storage_ptr__->pVars + lVar33 + -2)) & DAT_009b9400._0_15_;
    Var19 = CONCAT81(SUB158(ZEXT115(0) << 0x40,7),auVar48[3]);
    auVar26._9_6_ = 0;
    auVar26._0_9_ = Var19;
    auVar22._1_10_ = SUB1510(auVar26 << 0x30,5);
    auVar22[0] = auVar48[2];
    auVar27._11_4_ = 0;
    auVar27._0_11_ = auVar22;
    auVar47[2] = auVar48[1];
    auVar47._0_2_ = auVar48._0_2_;
    auVar47._3_12_ = SUB1512(auVar27 << 0x20,3);
    auVar18._2_13_ = auVar47._2_13_;
    auVar18._0_2_ = auVar48._0_2_ & 0xff;
    auVar14._10_2_ = 0;
    auVar14._0_10_ = auVar18._0_10_;
    auVar14._12_2_ = (short)Var19;
    uVar28 = CONCAT42(auVar14._10_4_,auVar22._0_2_);
    auVar23._6_8_ = 0;
    auVar23._0_6_ = uVar28;
    auVar16._4_2_ = auVar47._2_2_;
    auVar16._0_4_ = auVar18._0_4_;
    auVar16._6_8_ = SUB148(auVar23 << 0x40,6);
    auVar50._4_4_ = (int)(float)(iVar38 * 0x2000000 + 0x3f800000);
    auVar50._12_4_ = (int)(float)(iVar46 * 0x2000000 + 0x3f800000);
    auVar50._0_4_ = auVar50._4_4_;
    auVar50._8_4_ = auVar50._12_4_;
    uVar44 = uVar44 | (auVar18._0_4_ & 0xffff) * (int)(float)(iVar29 * 0x2000000 + 0x3f800000);
    uVar30 = uVar30 | auVar50._4_4_ * auVar16._4_4_;
    uVar43 = uVar43 | (uint)(((ulong)uVar28 & 0xffffffff) *
                            (ulong)(uint)(int)(float)(iVar45 * 0x2000000 + 0x3f800000));
    uVar37 = uVar37 | (uint)((auVar50._8_8_ & 0xffffffff) * (ulong)(auVar14._10_4_ >> 0x10));
    lVar33 = lVar33 + 4;
    iVar29 = iVar29 + 4;
    iVar38 = iVar38 + 4;
    iVar45 = iVar45 + 4;
    iVar46 = iVar46 + 4;
  } while (lVar33 != 8);
LAB_0041a0b0:
  *puVar32 = uVar37 | uVar30 | uVar43 | uVar44;
  return __return_storage_ptr__;
}

Assistant:

If_Grp_t If_CluCheck( If_Man_t * p, word * pTruth0, int nVars, int iVarStart, int iVarStop, int nLutLeaf, int nLutRoot, 
                     If_Grp_t * pR, word * pFunc0, word * pFunc1, word * pLeftOver, int fHashing )
{
//    int fEnableHashing = 0;
    If_Grp_t G1 = {0}, R = {0};
    unsigned * pHashed = NULL;
    word Truth, pTruth[CLU_WRD_MAX], pF[CLU_WRD_MAX];//, pG[CLU_WRD_MAX];
    int V2P[CLU_VAR_MAX+2], P2V[CLU_VAR_MAX+2], pCanonPerm[CLU_VAR_MAX];
    int i, nSupp, uCanonPhase;
    int nLutSize = p ? p->pPars->nLutSize : nVars;
    assert( nVars <= CLU_VAR_MAX );
    assert( nVars <= nLutLeaf + nLutRoot - 1 );

    if ( pR )
    {
        pR->nVars = 0;
        *pFunc0 = 0;
        *pFunc1 = 0;
    }

    // canonicize truth table
    If_CluCopy( pTruth, pTruth0, nLutSize );

    if ( 0 )
    {
        uCanonPhase = If_CluSemiCanonicize( pTruth, nVars, pCanonPerm );
        If_CluAdjustBig( pTruth, nVars, nLutSize );
    }

//    If_CluSemiCanonicizeVerify( pTruth, pTruth0, nVars, pCanonPerm, uCanonPhase );
//    If_CluCopy( pTruth, pTruth0, nLutSize );

 /*
    {
        int pCanonPerm[32];
        short pStore[32];
        unsigned uCanonPhase;
        If_CluCopy( pF, pTruth, nVars );
        uCanonPhase = Kit_TruthSemiCanonicize( pF, pG, nVars, pCanonPerm );
        G1.nVars = 1;
        return G1;
    }
*/
    // check minnimum base
    If_CluCopy( pF, pTruth, nVars );
    for ( i = 0; i < nVars; i++ )
        V2P[i] = P2V[i] = i;
    // check support
    nSupp = If_CluSupport( pF, nVars );
//Extra_PrintBinary( stdout, &nSupp, 16 );  printf( "\n" );
    if ( !nSupp || !If_CluSuppIsMinBase(nSupp) )
    {
//        assert( 0 );     
        return G1;
    }

    // check hash table
    if ( p && fHashing )
    {
        pHashed = If_CluHashLookup( p, pTruth, 0 );
        if ( pHashed && *pHashed != CLU_UNUSED )
            If_CluUns2Grp( *pHashed, &G1 );
    }

    // update the variable order so that the first var was the last one
    if ( iVarStop )
        If_CluMoveVar( pF, nVars, V2P, P2V, 0, nVars-1 );

    if ( G1.nVars == 0 ) 
    {
        s_Count2++;

        // detect easy cofs
        if ( iVarStart == 0 )
            G1 = If_CluDecUsingCofs( pTruth, nVars, nLutLeaf );
        if ( G1.nVars == 0 )
        {
            // perform testing
            G1 = If_CluFindGroup( pF, nVars, iVarStart, iVarStop, V2P, P2V, nLutLeaf, nLutLeaf + nLutRoot == nVars + 1 );
    //        If_CluCheckPerm( pTruth, pF, nVars, V2P, P2V );
            if ( G1.nVars == 0 )
            {
                // perform testing with a smaller set
                if ( nVars < nLutLeaf + nLutRoot - 2 )
                {
                    nLutLeaf--;
                    G1 = If_CluFindGroup( pF, nVars, iVarStart, iVarStop, V2P, P2V, nLutLeaf, nLutLeaf + nLutRoot == nVars + 1 );
                    nLutLeaf++;
                }
                // perform testing with a smaller set
                if ( nLutLeaf > 4 && nVars < nLutLeaf + nLutRoot - 3 )
                {
                    nLutLeaf--;
                    nLutLeaf--;
                    G1 = If_CluFindGroup( pF, nVars, iVarStart, iVarStop, V2P, P2V, nLutLeaf, nLutLeaf + nLutRoot == nVars + 1 );
                    nLutLeaf++;
                    nLutLeaf++;
                }
                if ( G1.nVars == 0 )
                {
                    // perform testing with a different order
                    If_CluReverseOrder( pF, nVars, V2P, P2V, iVarStart );
                    G1 = If_CluFindGroup( pF, nVars, iVarStart, iVarStop, V2P, P2V, nLutLeaf, nLutLeaf + nLutRoot == nVars + 1 );

                    // check permutation
    //                If_CluCheckPerm( pTruth, pF, nVars, V2P, P2V );
                    if ( G1.nVars == 0 )
                    {
                        // remember free set, just in case
//                        for ( i = 0; i < nVars - nLutLeaf; i++ )
///                           G1.pVars[nLutLeaf+i] = P2V[i];
                        // if <XY>, this will not be used
                        // if <XYZ>, this will not be hashed

    /*
                        if ( nVars == 6 )
                        {
                            Extra_PrintHex( stdout, (unsigned *)pF, nVars );  printf( "    " );
                            Kit_DsdPrintFromTruth( (unsigned*)pF, nVars );  printf( "\n" );
                            if ( !If_CutPerformCheck07( (unsigned *)pF, 6, 6, NULL ) )
                                printf( "no\n" );
                        } 
    */
                        if ( pHashed )
                            *pHashed = If_CluGrp2Uns( &G1 );
                        return G1;
                    }
                }
            }
        }
    }

    // derive
    if ( pR )
    {
        int iNewPos;

        If_CluMoveGroupToMsb( pF, nVars, V2P, P2V, &G1 );
        if ( G1.nMyu == 2 )
        {
            Truth = If_CluDeriveDisjoint( pF, nVars, V2P, P2V, &G1, &R );
            iNewPos = R.nVars - 1;
        }
        else
        {
            Truth = If_CluDeriveNonDisjoint( pF, nVars, V2P, P2V, &G1, &R );
            iNewPos = R.nVars - 2;
        }
        assert( R.pVars[iNewPos] == nVars );

        // adjust the functions
        Truth = If_CluAdjust( Truth, G1.nVars );
        if ( R.nVars < 6 )
            pF[0] = If_CluAdjust( pF[0], R.nVars );

//        Kit_DsdPrintFromTruth( (unsigned*)&Truth, G1.nVars ); printf( "  ...1\n" );
//        Kit_DsdPrintFromTruth( (unsigned*)pF, R.nVars );      printf( "  ...1\n" );

        // update the variable order of R so that the new var was the first one
//        if ( iVarStart == 0 )
        {
            int k, V2P2[CLU_VAR_MAX+2], P2V2[CLU_VAR_MAX+2];
            assert( iNewPos >= iVarStart );
            for ( k = 0; k < R.nVars; k++ )
                V2P2[k] = P2V2[k] = k;
            If_CluMoveVar( pF, R.nVars, V2P2, P2V2, iNewPos, iVarStart );
            for ( k = iNewPos; k > iVarStart; k-- )
                R.pVars[k] = R.pVars[k-1];
            R.pVars[iVarStart] = nVars;
        }

//        Kit_DsdPrintFromTruth( (unsigned*)pF, R.nVars ); printf( "  ...2\n" );

        if ( pLeftOver )
        {
            if ( R.nVars < 6 )
                *pLeftOver = If_CluAdjust( pF[0], R.nVars );
            else
                If_CluCopy( pLeftOver, pF, R.nVars );
            If_CluAdjustBig( pLeftOver, R.nVars, nLutSize );
        }

        // perform checking
        if ( 0 )
        {
            If_CluCheckGroup( pTruth, nVars, &G1 );
            If_CluVerify( pTruth, nVars, &G1, &R, Truth, pF );
        } 

        // save functions
        *pR = R;
        if ( pFunc0 )
            *pFunc0 = pF[0];
        if ( pFunc1 )
            *pFunc1 = Truth;
    }

    if ( pHashed )
        *pHashed = If_CluGrp2Uns( &G1 );
    return G1;
}